

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  void *pvVar1;
  StringPiece *local_40;
  char *result;
  size_type pos_local;
  char c_local;
  StringPiece *this_local;
  
  if ((this->length_ < 1) || ((ulong)this->length_ <= pos)) {
    this_local = (StringPiece *)0xffffffffffffffff;
  }
  else {
    pvVar1 = memchr(this->ptr_ + pos,(int)c,this->length_ - pos);
    if (pvVar1 == (void *)0x0) {
      local_40 = (StringPiece *)0xffffffffffffffff;
    }
    else {
      local_40 = (StringPiece *)((long)pvVar1 - (long)this->ptr_);
    }
    this_local = local_40;
  }
  return (stringpiece_ssize_type)this_local;
}

Assistant:

stringpiece_ssize_type StringPiece::find(char c, size_type pos) const {
  if (length_ <= 0 || pos >= static_cast<size_type>(length_)) {
    return npos;
  }
  const char* result = static_cast<const char*>(
      memchr(ptr_ + pos, c, length_ - pos));
  return result != NULL ? result - ptr_ : npos;
}